

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test<std::__cxx11::list<int,std::allocator<int>>>
               (list<int,_std::allocator<int>_> *value,serialization_category category,
               size_t serial_size)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  fail_flag_serialization_policy local_60 [8];
  _List_base<int,_std::allocator<int>_> local_58;
  binary_istream istream;
  
  if (category == container) {
    local_60[0].overflow = false;
    detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                        *)local_60,value);
    if (local_60[0].overflow == true) {
      __assertion = "!ostream.overflow";
      __line = 0x10;
    }
    else if (((value->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size &
             0x3fffffffffffffff) == 0x3ffffffffffffffe) {
      if (serial_size == 0) {
        local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_58;
        local_58._M_impl._M_node._M_size = 0;
        istream.super_span<const_std::byte>.begin_ = buffer._M_elems;
        istream.super_span<const_std::byte>.end_ = &DAT_0010b501;
        istream.
        super_istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
        .
        super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
        .super_fail_flag_serialization_policy.overflow =
             (stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
              )(fail_flag_serialization_policy)0x0;
        local_58._M_impl._M_node.super__List_node_base._M_prev =
             local_58._M_impl._M_node.super__List_node_base._M_next;
        detail::operator>>(&istream.
                            super_istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                           ,(list<int,_std::allocator<int>_> *)
                            local_58._M_impl._M_node.super__List_node_base._M_next);
        if ((array<std::byte,_1000UL> *)istream.super_span<const_std::byte>.begin_ == &buffer) {
          bVar1 = std::operator==(value,(list<int,_std::allocator<int>_> *)&local_58);
          if (bVar1) {
            local_60[0].overflow = false;
            detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                                *)local_60,value);
            if (local_60[0].overflow != false) {
              std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear(&local_58);
              return;
            }
            __assertion = "ostream.overflow";
            __line = 0x1f;
          }
          else {
            __assertion = "value == value_copy";
            __line = 0x1b;
          }
        }
        else {
          __assertion = "ostream.data() == istream.data()";
          __line = 0x1a;
        }
      }
      else {
        __assertion = "size == serial_size";
        __line = 0x14;
      }
    }
    else {
      __assertion = "size == get_serialized_size(value)";
      __line = 0x13;
    }
  }
  else {
    __assertion = "serialization_category_v<T> == category";
    __line = 0xc;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                ,__line,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
  ;
}

Assistant:

void test(T const& value, serialization_category category, size_t serial_size) {
    assert(serialization_category_v<T> == category);

    auto ostream = binary_ostream{ buffer };
    ostream << value;
    assert(!ostream.overflow);

    size_t const size = ostream.data() - buffer.data();
    assert(size == get_serialized_size(value));
    assert(size == serial_size);

    auto value_copy = T{};
    auto istream = binary_istream{ buffer };
    istream >> value_copy;

    assert(ostream.data() == istream.data());
    assert(value == value_copy);

    ostream = { buffer.data(), serial_size - 1 };
    ostream << value;
    assert(ostream.overflow);
}